

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringpiece.cc
# Opt level: O1

bool __thiscall google::protobuf::StringPiece::ConsumeFromEnd(StringPiece *this,StringPiece x)

{
  int iVar1;
  size_t __n;
  long lVar2;
  bool bVar3;
  
  __n = x.length_;
  lVar2 = this->length_ - __n;
  if (this->length_ < (long)__n) {
    bVar3 = false;
  }
  else {
    iVar1 = bcmp(this->ptr_ + lVar2,x.ptr_,__n);
    bVar3 = iVar1 == 0;
  }
  if (bVar3 != false) {
    this->length_ = lVar2;
  }
  return bVar3;
}

Assistant:

bool StringPiece::ConsumeFromEnd(StringPiece x) {
  if (ends_with(x)) {
    length_ -= x.length_;
    return true;
  }
  return false;
}